

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_count_quantity.cpp
# Opt level: O2

void __thiscall
polyscope::SurfaceCountQuantity::setUniforms(SurfaceCountQuantity *this,ShaderProgram *p)

{
  bool bVar1;
  float fVar2;
  vec4 vVar3;
  mat4 Pinv;
  mat4 P;
  allocator local_139;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  mat<4,_4,_float,_(glm::qualifier)0> local_98;
  mat<4,_4,_float,_(glm::qualifier)0> local_58;
  
  view::getCameraPerspectiveMatrix();
  glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call(&local_98,&local_58);
  std::__cxx11::string::string(local_b8,"u_invProjMatrix",&local_139);
  (*p->_vptr_ShaderProgram[7])(p,local_b8,&local_98);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::string(local_d8,"u_viewport",&local_139);
  vVar3 = render::Engine::getCurrentViewport(render::engine);
  (*p->_vptr_ShaderProgram[10])(vVar3._0_8_,vVar3._8_8_,p,local_d8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::string(local_f8,"u_pointRadius",&local_139);
  bVar1 = (this->pointRadius).value.relativeFlag;
  fVar2 = (this->pointRadius).value.value;
  (*p->_vptr_ShaderProgram[5])
            ((ulong)((uint)(bVar1 & 1) * (int)(float)((double)fVar2 * state::lengthScale) +
                    (uint)!(bool)(bVar1 & 1) * (int)fVar2),p,local_f8);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::string(local_118,"u_rangeLow",&local_139);
  (*p->_vptr_ShaderProgram[5])((ulong)(uint)this->vizRangeLow,p,local_118);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::string(local_138,"u_rangeHigh",&local_139);
  (*p->_vptr_ShaderProgram[5])((ulong)(uint)this->vizRangeHigh,p,local_138);
  std::__cxx11::string::~string(local_138);
  return;
}

Assistant:

void SurfaceCountQuantity::setUniforms(render::ShaderProgram& p) {
  glm::mat4 P = view::getCameraPerspectiveMatrix();
  glm::mat4 Pinv = glm::inverse(P);
  p.setUniform("u_invProjMatrix", glm::value_ptr(Pinv));
  p.setUniform("u_viewport", render::engine->getCurrentViewport());

  p.setUniform("u_pointRadius", pointRadius.get().asAbsolute());
  p.setUniform("u_rangeLow", vizRangeLow);
  p.setUniform("u_rangeHigh", vizRangeHigh);
}